

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

void __thiscall
HighsOrbitopeMatrix::determineOrbitopeType(HighsOrbitopeMatrix *this,HighsCliqueTable *cliquetable)

{
  HighsHashTable<int,_int> *pHVar1;
  pointer pcVar2;
  bool bVar3;
  CliqueVar *pCVar4;
  int iVar5;
  vector<signed_char,_std::allocator<signed_char>_> *pvVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  pointer piVar11;
  pair<const_HighsCliqueTable::CliqueVar_*,_int> pVar12;
  u8 meta;
  u64 pos;
  u64 maxPos;
  u64 startPos;
  u8 local_89;
  undefined8 local_88;
  ulong local_80;
  uint local_74;
  ulong local_70;
  pointer local_68;
  pointer local_60;
  vector<signed_char,_std::allocator<signed_char>_> *local_58;
  HighsOrbitopeMatrix *local_50;
  HighsCliqueTable *local_48;
  u64 local_40;
  u64 local_38;
  
  local_48 = cliquetable;
  if (0 < this->rowLength) {
    lVar9 = 0;
    do {
      local_88._0_4_ = 0;
      iVar8 = this->numRows;
      if (0 < iVar8) {
        do {
          HighsHashTable<int,int>::insert<int&,int&>
                    ((HighsHashTable<int,int> *)&this->columnToRow,
                     (this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + iVar8 * lVar9 + (long)(int)local_88,
                     (int *)&local_88);
          local_88._0_4_ = (int)local_88 + 1;
          iVar8 = this->numRows;
        } while ((int)local_88 < iVar8);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->rowLength);
  }
  pvVar6 = &this->rowIsSetPacking;
  local_88._0_4_ = CONCAT31(local_88._1_3_,0xff);
  std::vector<signed_char,_std::allocator<signed_char>_>::_M_fill_assign
            (pvVar6,(long)this->numRows,(value_type *)&local_88);
  this->numSetPackingRows = 0;
  local_58 = pvVar6;
  local_50 = this;
  if (1 < this->rowLength) {
    pHVar1 = &this->columnToRow;
    local_70 = 1;
    do {
      local_60 = (this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + (long)this->numRows * local_70;
      local_80 = 0;
      do {
        if (0 < (long)this->numRows) {
          piVar11 = (this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + (long)this->numRows * local_80;
          uVar7 = 0;
          local_68 = piVar11;
          do {
            if ((pvVar6->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar7] == -1) {
              pVar12 = HighsCliqueTable::findCommonClique
                                 (local_48,(CliqueVar)(piVar11[uVar7] | 0x80000000),
                                  (CliqueVar)(local_60[uVar7] | 0x80000000));
              pCVar4 = pVar12.first;
              if (pCVar4 == (CliqueVar *)0x0) {
                (pvVar6->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar7] = '\0';
                lVar9 = 0;
              }
              else {
                if (pVar12.second < 1) {
                  iVar8 = 0;
                }
                else {
                  uVar10 = 0;
                  iVar8 = 0;
                  do {
                    if ((int)pCVar4[uVar10] < 0) {
                      local_74 = (uint)pCVar4[uVar10] & 0x7fffffff;
                      bVar3 = HighsHashTable<int,_int>::findPosition
                                        (pHVar1,(KeyType_conflict *)&local_74,&local_89,&local_38,
                                         &local_40,&local_88);
                      if (bVar3) {
                        iVar8 = iVar8 + (uint)(uVar7 == (uint)*(int *)((long)((pHVar1->entries)._M_t
                                                                              .
                                                  super___uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_int>_*,_HighsHashTable<int,_int>::OpNewDeleter>
                                                  .
                                                  super__Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false>
                                                  ._M_head_impl +
                                                  CONCAT44(local_88._4_4_,(int)local_88)) + 4));
                      }
                    }
                    uVar10 = uVar10 + 1;
                  } while ((uint)pVar12.second != uVar10);
                }
                pvVar6 = local_58;
                this = local_50;
                piVar11 = local_68;
                if (iVar8 == local_50->rowLength) {
                  (local_50->rowIsSetPacking).
                  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7] = '\x01';
                  iVar8 = local_50->numSetPackingRows + 1;
                  local_50->numSetPackingRows = iVar8;
                  lVar9 = 0xe;
                  if (iVar8 == local_50->numRows) goto LAB_002fe82c;
                }
                lVar9 = 0;
              }
LAB_002fe82c:
              if (lVar9 != 0) break;
            }
            uVar7 = uVar7 + 1;
          } while ((long)uVar7 < (long)this->numRows);
        }
      } while ((this->numSetPackingRows != this->numRows) &&
              (local_80 = local_80 + 1, local_80 < local_70));
    } while ((this->numSetPackingRows != this->numRows) &&
            (local_70 = local_70 + 1, (long)local_70 < (long)this->rowLength));
  }
  if (0 < this->numRows) {
    lVar9 = 0;
    do {
      pcVar2 = (pvVar6->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pcVar2[lVar9] == '\0') {
        pcVar2[lVar9] = -1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->numRows);
  }
  if (1 < this->rowLength) {
    pHVar1 = &this->columnToRow;
    local_70 = 1;
    do {
      local_60 = (this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + (long)this->numRows * local_70;
      local_80 = 0;
      do {
        if (0 < (long)this->numRows) {
          piVar11 = (this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + (long)this->numRows * local_80;
          uVar7 = 0;
          local_68 = piVar11;
          do {
            if ((pvVar6->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar7] == -1) {
              pVar12 = HighsCliqueTable::findCommonClique
                                 (local_48,(CliqueVar)(piVar11[uVar7] & 0x7fffffff),
                                  (CliqueVar)(local_60[uVar7] & 0x7fffffff));
              pCVar4 = pVar12.first;
              if (pCVar4 == (CliqueVar *)0x0) {
                (pvVar6->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar7] = '\0';
                iVar8 = 0x1f;
              }
              else {
                if (pVar12.second < 1) {
                  iVar8 = 0;
                }
                else {
                  uVar10 = 0;
                  iVar8 = 0;
                  do {
                    if (-1 < (int)pCVar4[uVar10]) {
                      local_74 = (uint)pCVar4[uVar10] & 0x7fffffff;
                      bVar3 = HighsHashTable<int,_int>::findPosition
                                        (pHVar1,(KeyType_conflict *)&local_74,&local_89,&local_38,
                                         &local_40,&local_88);
                      if (bVar3) {
                        iVar8 = iVar8 + (uint)(uVar7 == (uint)*(int *)((long)((pHVar1->entries)._M_t
                                                                              .
                                                  super___uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_int>_*,_HighsHashTable<int,_int>::OpNewDeleter>
                                                  .
                                                  super__Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false>
                                                  ._M_head_impl +
                                                  CONCAT44(local_88._4_4_,(int)local_88)) + 4));
                      }
                    }
                    uVar10 = uVar10 + 1;
                  } while ((uint)pVar12.second != uVar10);
                }
                pvVar6 = local_58;
                this = local_50;
                piVar11 = local_68;
                if (iVar8 == local_50->rowLength) {
                  (local_50->rowIsSetPacking).
                  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7] = '\x02';
                  iVar5 = local_50->numSetPackingRows + 1;
                  local_50->numSetPackingRows = iVar5;
                  iVar8 = 0x1d;
                  if (iVar5 == local_50->numRows) goto LAB_002fe9e1;
                }
                iVar8 = 0;
              }
LAB_002fe9e1:
              if ((iVar8 != 0x1f) && (iVar8 != 0)) break;
            }
            uVar7 = uVar7 + 1;
          } while ((long)uVar7 < (long)this->numRows);
        }
      } while ((this->numSetPackingRows != this->numRows) &&
              (local_80 = local_80 + 1, local_80 < local_70));
    } while ((this->numSetPackingRows != this->numRows) &&
            (local_70 = local_70 + 1, (long)local_70 < (long)this->rowLength));
  }
  return;
}

Assistant:

void HighsOrbitopeMatrix::determineOrbitopeType(HighsCliqueTable& cliquetable) {
  for (HighsInt j = 0; j < rowLength; ++j) {
    for (HighsInt i = 0; i < numRows; ++i) {
      columnToRow.insert(entry(i, j), i);
    }
  }

  rowIsSetPacking.assign(numRows, -1);
  numSetPackingRows = 0;

  for (HighsInt j = 1; j < rowLength; ++j) {
    HighsInt* colj1 = &entry(0, j);

    for (HighsInt j0 = 0; j0 < j; ++j0) {
      HighsInt* colj0 = &entry(0, j0);

      for (HighsInt i = 0; i < numRows; ++i) {
        if (rowIsSetPacking[i] != -1) continue;

        HighsInt xj0 = colj0[i];
        HighsInt xj1 = colj1[i];

        auto commonClique = cliquetable.findCommonClique({xj0, 1}, {xj1, 1});

        if (commonClique.first == nullptr) {
          rowIsSetPacking[i] = false;
          continue;
        }

        HighsInt overlap = 0;

        for (HighsInt k = 0; k < commonClique.second; ++k) {
          if (commonClique.first[k].val == 0) continue;

          HighsInt* cliqueColRow = columnToRow.find(commonClique.first[k].col);
          if (cliqueColRow && *cliqueColRow == i) ++overlap;
        }

        if (overlap == rowLength) {
          rowIsSetPacking[i] = true;
          ++numSetPackingRows;
          if (numSetPackingRows == numRows) break;
        }
      }

      if (numSetPackingRows == numRows) break;
    }

    if (numSetPackingRows == numRows) break;
  }

  // now for the rows that do not have a set packing structure check
  // if we have such structure when all columns in the row are negated

  for (HighsInt i = 0; i < numRows; ++i) {
    if (!rowIsSetPacking[i]) rowIsSetPacking[i] = -1;
  }

  for (HighsInt j = 1; j < rowLength; ++j) {
    HighsInt* colj1 = &entry(0, j);

    for (HighsInt j0 = 0; j0 < j; ++j0) {
      HighsInt* colj0 = &entry(0, j0);

      for (HighsInt i = 0; i < numRows; ++i) {
        if (rowIsSetPacking[i] != -1) continue;

        HighsInt xj0 = colj0[i];
        HighsInt xj1 = colj1[i];

        // now look for cliques with value 0
        auto commonClique = cliquetable.findCommonClique({xj0, 0}, {xj1, 0});

        if (commonClique.first == nullptr) {
          rowIsSetPacking[i] = false;
          continue;
        }

        HighsInt overlap = 0;

        for (HighsInt k = 0; k < commonClique.second; ++k) {
          // skip clique variables with values of 1
          if (commonClique.first[k].val == 1) continue;

          HighsInt* cliqueColRow = columnToRow.find(commonClique.first[k].col);
          if (cliqueColRow && *cliqueColRow == i) ++overlap;
        }

        if (overlap == rowLength) {
          // mark with value 2, for negated set packing row with at most one
          // zero
          rowIsSetPacking[i] = 2;
          ++numSetPackingRows;
          if (numSetPackingRows == numRows) break;
        }
      }

      if (numSetPackingRows == numRows) break;
    }

    if (numSetPackingRows == numRows) break;
  }
}